

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hpp
# Opt level: O2

void __thiscall VariableSymbol::~VariableSymbol(VariableSymbol *this)

{
  ~VariableSymbol(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

VariableSymbol(const std::string& name, const TypeName& type):
    name_(name), type_(type) {}